

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

QModelIndex * __thiscall
QGenericItemModel::sibling(QGenericItemModel *this,int row,int column,QModelIndex *index)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  ConstOp unaff_retaddr;
  QGenericItemModelImplBase *in_stack_00000008;
  int *args;
  
  args = *(int **)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84f730);
  QGenericItemModelImplBase::callConst<QModelIndex,int,int,QModelIndex>
            (in_stack_00000008,unaff_retaddr,args,(int *)CONCAT44(in_EDX,in_ECX),in_RSI);
  if (*(int **)(in_FS_OFFSET + 0x28) == args) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QGenericItemModel::sibling(int row, int column, const QModelIndex &index) const
{
    return impl->callConst<QModelIndex>(QGenericItemModelImplBase::Sibling, row, column, index);
}